

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O1

Ref<embree::SceneGraph::Node> __thiscall
embree::SceneGraph::convert_quads_to_subdivs(SceneGraph *this,Ref<embree::SceneGraph::Node> *node)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  pointer *ppuVar1;
  value_type *pvVar2;
  iterator iVar3;
  bool bVar4;
  long *plVar5;
  long *plVar6;
  SubdivMeshNode *this_01;
  long lVar7;
  uint uVar8;
  uint *puVar9;
  ulong uVar10;
  long lVar11;
  vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_> *p;
  value_type *__x;
  long local_78;
  long *local_70;
  Node *local_68;
  Ref<embree::SceneGraph::Node> *local_60;
  long *local_58;
  Ref<embree::SceneGraph::MaterialNode> local_50;
  Ref<embree::SceneGraph::Node> local_48;
  Ref<embree::SceneGraph::Node> local_40;
  Ref<embree::SceneGraph::Node> local_38;
  
  if (node->ptr == (Node *)0x0) {
    plVar5 = (long *)0x0;
  }
  else {
    plVar5 = (long *)__dynamic_cast(node->ptr,&Node::typeinfo,&TransformNode::typeinfo,0);
  }
  if (plVar5 == (long *)0x0) {
    if (node->ptr == (Node *)0x0) {
      plVar6 = (long *)0x0;
    }
    else {
      plVar6 = (long *)__dynamic_cast(node->ptr,&Node::typeinfo,&MultiTransformNode::typeinfo,0);
    }
    local_70 = plVar5;
    local_68 = (Node *)this;
    local_60 = node;
    local_58 = plVar6;
    if (plVar6 == (long *)0x0) {
      if (node->ptr == (Node *)0x0) {
        plVar5 = (long *)0x0;
      }
      else {
        plVar5 = (long *)__dynamic_cast(node->ptr,&Node::typeinfo,&GroupNode::typeinfo,0);
      }
      if (plVar5 == (long *)0x0) {
        if (local_60->ptr == (Node *)0x0) {
          plVar6 = (long *)0x0;
        }
        else {
          plVar6 = (long *)__dynamic_cast(local_60->ptr,&Node::typeinfo,&QuadMeshNode::typeinfo,0);
        }
        if (plVar6 != (long *)0x0) {
          (**(code **)(*plVar6 + 0x10))(plVar6);
          this_01 = (SubdivMeshNode *)operator_new(0x1b0);
          local_50.ptr = (MaterialNode *)plVar6[0x1a];
          if (local_50.ptr != (MaterialNode *)0x0) {
            (*((local_50.ptr)->super_Node).super_RefCount._vptr_RefCount[2])();
          }
          SubdivMeshNode::SubdivMeshNode(this_01,&local_50,*(BBox1f *)(plVar6 + 0xd),0);
          (*(this_01->super_Node).super_RefCount._vptr_RefCount[2])(this_01);
          if (local_50.ptr != (MaterialNode *)0x0) {
            (*((local_50.ptr)->super_Node).super_RefCount._vptr_RefCount[3])();
          }
          __x = (value_type *)plVar6[0xe];
          pvVar2 = (value_type *)plVar6[0xf];
          if (__x != pvVar2) {
            do {
              std::
              vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
              ::push_back(&this_01->positions,__x);
              __x = __x + 1;
            } while (__x != pvVar2);
          }
          lVar7 = plVar6[0x17];
          if (plVar6[0x18] != lVar7) {
            this_00 = &this_01->position_indices;
            lVar11 = 8;
            uVar10 = 0;
            do {
              puVar9 = (uint *)(lVar7 + lVar11 + -8);
              iVar3._M_current =
                   (this_01->position_indices).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (iVar3._M_current ==
                  (this_01->position_indices).
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<unsigned_int,std::allocator<unsigned_int>>::
                _M_realloc_insert<unsigned_int_const&>
                          ((vector<unsigned_int,std::allocator<unsigned_int>> *)this_00,iVar3,puVar9
                          );
              }
              else {
                *iVar3._M_current = *puVar9;
                ppuVar1 = &(this_01->position_indices).
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_finish;
                *ppuVar1 = *ppuVar1 + 1;
              }
              puVar9 = (uint *)(plVar6[0x17] + lVar11 + -4);
              iVar3._M_current =
                   (this_01->position_indices).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (iVar3._M_current ==
                  (this_01->position_indices).
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<unsigned_int,std::allocator<unsigned_int>>::
                _M_realloc_insert<unsigned_int_const&>
                          ((vector<unsigned_int,std::allocator<unsigned_int>> *)this_00,iVar3,puVar9
                          );
              }
              else {
                *iVar3._M_current = *puVar9;
                ppuVar1 = &(this_01->position_indices).
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_finish;
                *ppuVar1 = *ppuVar1 + 1;
              }
              iVar3._M_current =
                   (this_01->position_indices).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (iVar3._M_current ==
                  (this_01->position_indices).
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<unsigned_int,std::allocator<unsigned_int>>::
                _M_realloc_insert<unsigned_int_const&>
                          ((vector<unsigned_int,std::allocator<unsigned_int>> *)this_00,iVar3,
                           (uint *)(plVar6[0x17] + lVar11));
              }
              else {
                *iVar3._M_current = *(uint *)(plVar6[0x17] + lVar11);
                ppuVar1 = &(this_01->position_indices).
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_finish;
                *ppuVar1 = *ppuVar1 + 1;
              }
              lVar7 = plVar6[0x17];
              uVar8 = *(uint *)(lVar7 + 4 + lVar11);
              if (*(uint *)(lVar7 + lVar11) != uVar8) {
                iVar3._M_current =
                     (this_01->position_indices).
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_finish;
                if (iVar3._M_current ==
                    (this_01->position_indices).
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<unsigned_int,std::allocator<unsigned_int>>::
                  _M_realloc_insert<unsigned_int_const&>
                            ((vector<unsigned_int,std::allocator<unsigned_int>> *)this_00,iVar3,
                             (uint *)(lVar7 + lVar11 + 4));
                }
                else {
                  *iVar3._M_current = uVar8;
                  ppuVar1 = &(this_01->position_indices).
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_finish;
                  *ppuVar1 = *ppuVar1 + 1;
                }
              }
              uVar10 = uVar10 + 1;
              lVar7 = plVar6[0x17];
              lVar11 = lVar11 + 0x10;
            } while (uVar10 < (ulong)(plVar6[0x18] - lVar7 >> 4));
          }
          std::
          vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
          ::operator=(&this_01->normals,
                      (vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                       *)(plVar6 + 0x11));
          if ((this_01->normals).
              super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              (this_01->normals).
              super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                      (&this_01->normal_indices,&this_01->position_indices);
          }
          std::vector<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_>::operator=
                    (&this_01->texcoords,
                     (vector<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_> *)
                     (plVar6 + 0x14));
          if ((this_01->texcoords).
              super__Vector_base<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_>._M_impl
              .super__Vector_impl_data._M_finish !=
              (this_01->texcoords).
              super__Vector_base<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_>._M_impl
              .super__Vector_impl_data._M_start) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                      (&this_01->texcoord_indices,&this_01->position_indices);
          }
          lVar7 = plVar6[0x17];
          if (plVar6[0x18] != lVar7) {
            lVar11 = 0xc;
            uVar10 = 0;
            do {
              uVar8 = (*(int *)(lVar7 + -4 + lVar11) != *(int *)(lVar7 + lVar11)) + 3;
              local_78 = CONCAT44(local_78._4_4_,uVar8);
              iVar3._M_current =
                   (this_01->verticesPerFace).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (iVar3._M_current ==
                  (this_01->verticesPerFace).
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                _M_realloc_insert<unsigned_int>(&this_01->verticesPerFace,iVar3,(uint *)&local_78);
              }
              else {
                *iVar3._M_current = uVar8;
                ppuVar1 = &(this_01->verticesPerFace).
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_finish;
                *ppuVar1 = *ppuVar1 + 1;
              }
              uVar10 = uVar10 + 1;
              lVar7 = plVar6[0x17];
              lVar11 = lVar11 + 0x10;
            } while (uVar10 < (ulong)(plVar6[0x18] - lVar7 >> 4));
          }
          (local_68->super_RefCount)._vptr_RefCount = (_func_int **)this_01;
          (*(this_01->super_Node).super_RefCount._vptr_RefCount[2])(this_01);
          (*(this_01->super_Node).super_RefCount._vptr_RefCount[3])(this_01);
          (**(code **)(*plVar6 + 0x18))(plVar6);
          if (local_58 == (long *)0x0) {
            bVar4 = false;
            plVar5 = local_70;
            node = local_60;
            this = (SceneGraph *)local_68;
          }
          else {
            (**(code **)(*local_58 + 0x18))();
            bVar4 = false;
            plVar5 = local_70;
            node = local_60;
            this = (SceneGraph *)local_68;
          }
          goto LAB_00151b74;
        }
      }
      else {
        (**(code **)(*plVar5 + 0x10))(plVar5);
        lVar7 = plVar5[0xd];
        if (plVar5[0xe] != lVar7) {
          uVar10 = 0;
          do {
            local_48.ptr = *(Node **)(lVar7 + uVar10 * 8);
            if (local_48.ptr != (Node *)0x0) {
              (*((local_48.ptr)->super_RefCount)._vptr_RefCount[2])();
            }
            convert_quads_to_subdivs((SceneGraph *)&local_78,&local_48);
            lVar7 = plVar5[0xd];
            plVar6 = *(long **)(lVar7 + uVar10 * 8);
            if (plVar6 != (long *)0x0) {
              (**(code **)(*plVar6 + 0x18))();
            }
            *(long *)(lVar7 + uVar10 * 8) = local_78;
            local_78 = 0;
            if (local_48.ptr != (Node *)0x0) {
              (*((local_48.ptr)->super_RefCount)._vptr_RefCount[3])();
            }
            uVar10 = uVar10 + 1;
            lVar7 = plVar5[0xd];
          } while (uVar10 < (ulong)(plVar5[0xe] - lVar7 >> 3));
        }
      }
      if (plVar5 != (long *)0x0) {
        (**(code **)(*plVar5 + 0x18))(plVar5);
      }
    }
    else {
      (**(code **)(*plVar6 + 0x10))(plVar6);
      local_40.ptr = (Node *)plVar6[0x10];
      if (local_40.ptr != (Node *)0x0) {
        (*((local_40.ptr)->super_RefCount)._vptr_RefCount[2])();
      }
      convert_quads_to_subdivs((SceneGraph *)&local_78,&local_40);
      if ((long *)plVar6[0x10] != (long *)0x0) {
        (**(code **)(*(long *)plVar6[0x10] + 0x18))();
      }
      plVar6[0x10] = local_78;
      local_78 = 0;
      if (local_40.ptr != (Node *)0x0) {
        (*((local_40.ptr)->super_RefCount)._vptr_RefCount[3])();
      }
    }
    bVar4 = true;
    plVar5 = local_70;
    node = local_60;
    this = (SceneGraph *)local_68;
    if (local_58 != (long *)0x0) {
      (**(code **)(*local_58 + 0x18))();
      plVar5 = local_70;
      node = local_60;
      this = (SceneGraph *)local_68;
      bVar4 = true;
    }
  }
  else {
    (**(code **)(*plVar5 + 0x10))(plVar5);
    local_38.ptr = (Node *)plVar5[0x13];
    if (local_38.ptr != (Node *)0x0) {
      (*((local_38.ptr)->super_RefCount)._vptr_RefCount[2])();
    }
    convert_quads_to_subdivs((SceneGraph *)&local_78,&local_38);
    if ((long *)plVar5[0x13] != (long *)0x0) {
      (**(code **)(*(long *)plVar5[0x13] + 0x18))();
    }
    plVar5[0x13] = local_78;
    local_78 = 0;
    if (local_38.ptr != (Node *)0x0) {
      (*((local_38.ptr)->super_RefCount)._vptr_RefCount[3])();
    }
    bVar4 = true;
  }
LAB_00151b74:
  if (plVar5 != (long *)0x0) {
    (**(code **)(*plVar5 + 0x18))(plVar5);
  }
  if (bVar4) {
    (((Node *)this)->super_RefCount)._vptr_RefCount = (_func_int **)node->ptr;
    node->ptr = (Node *)0x0;
  }
  return (Ref<embree::SceneGraph::Node>)(Node *)this;
}

Assistant:

Ref<SceneGraph::Node> SceneGraph::convert_quads_to_subdivs(Ref<SceneGraph::Node> node)
  {
    if (Ref<SceneGraph::TransformNode> xfmNode = node.dynamicCast<SceneGraph::TransformNode>()) {
      xfmNode->child = convert_quads_to_subdivs(xfmNode->child);
    }
    else if (Ref<SceneGraph::MultiTransformNode> xfmNode = node.dynamicCast<SceneGraph::MultiTransformNode>()) {
      xfmNode->child = convert_quads_to_subdivs(xfmNode->child);
    }
    else if (Ref<SceneGraph::GroupNode> groupNode = node.dynamicCast<SceneGraph::GroupNode>()) 
    {
      for (size_t i=0; i<groupNode->children.size(); i++) 
        groupNode->children[i] = convert_quads_to_subdivs(groupNode->children[i]);
    }
    else if (Ref<SceneGraph::QuadMeshNode> tmesh = node.dynamicCast<SceneGraph::QuadMeshNode>()) 
    {
      Ref<SceneGraph::SubdivMeshNode> smesh = new SceneGraph::SubdivMeshNode(tmesh->material,tmesh->time_range,0);

      for (auto& p : tmesh->positions)
        smesh->positions.push_back(p);

      for (size_t i=0; i<tmesh->quads.size(); i++) {
        smesh->position_indices.push_back(tmesh->quads[i].v0);
        smesh->position_indices.push_back(tmesh->quads[i].v1);
        smesh->position_indices.push_back(tmesh->quads[i].v2);
        if (tmesh->quads[i].v2 != tmesh->quads[i].v3)
          smesh->position_indices.push_back(tmesh->quads[i].v3);
      }
      
      smesh->normals = tmesh->normals;
      if (smesh->normals.size())
        smesh->normal_indices = smesh->position_indices;
      
      smesh->texcoords = tmesh->texcoords;
      if (smesh->texcoords.size())
        smesh->texcoord_indices = smesh->position_indices;
      
      for (size_t i=0; i<tmesh->quads.size(); i++) 
        smesh->verticesPerFace.push_back(3 + (int)(tmesh->quads[i].v2 != tmesh->quads[i].v3));

      return smesh.dynamicCast<SceneGraph::Node>();
    }
    return node;
  }